

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

ON_Object * __thiscall ON_ObjRef::ProxyObject(ON_ObjRef *this,int proxy_object_index)

{
  ON_Object *local_30;
  ON_Object *local_28;
  int proxy_object_index_local;
  ON_ObjRef *this_local;
  
  if (proxy_object_index == 1) {
    local_28 = this->m__proxy1;
  }
  else {
    if (proxy_object_index == 2) {
      local_30 = this->m__proxy2;
    }
    else {
      local_30 = (ON_Object *)0x0;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

const ON_Object* ON_ObjRef::ProxyObject(int proxy_object_index) const
{
  return ( (1 == proxy_object_index) 
           ? m__proxy1 
           : ((2==proxy_object_index) ? m__proxy2 : 0) 
         );
}